

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcUtil.c
# Opt level: O3

int Abc_NtkIsTopo(Abc_Ntk_t *pNtk)

{
  ulong uVar1;
  undefined4 uVar2;
  long *plVar3;
  long *plVar4;
  long lVar5;
  int iVar6;
  int *__s;
  Vec_Ptr_t *pVVar7;
  int Fill;
  int extraout_EDX;
  long in_RDX;
  long extraout_RDX;
  long extraout_RDX_00;
  long extraout_RDX_01;
  long extraout_RDX_02;
  int iVar8;
  long lVar9;
  long lVar10;
  int local_3c;
  
  if ((pNtk->vTravIds).pArray == (int *)0x0) {
    iVar6 = pNtk->vObjs->nSize;
    uVar1 = (long)iVar6 + 500;
    iVar8 = (int)uVar1;
    if ((pNtk->vTravIds).nCap < iVar8) {
      __s = (int *)malloc(uVar1 * 4);
      (pNtk->vTravIds).pArray = __s;
      if (__s == (int *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      (pNtk->vTravIds).nCap = iVar8;
      in_RDX = extraout_RDX;
    }
    else {
      __s = (int *)0x0;
    }
    if (-500 < iVar6) {
      memset(__s,0,(uVar1 & 0xffffffff) << 2);
      in_RDX = extraout_RDX_00;
    }
    (pNtk->vTravIds).nSize = iVar8;
  }
  iVar6 = pNtk->nTravIds;
  pNtk->nTravIds = iVar6 + 1;
  if (0x3ffffffe < iVar6) {
    __assert_fail("p->nTravIds < (1<<30)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abc.h"
                  ,0x198,"void Abc_NtkIncrementTravId(Abc_Ntk_t *)");
  }
  pVVar7 = pNtk->vCis;
  if (0 < pVVar7->nSize) {
    lVar9 = 0;
    do {
      lVar10 = *pVVar7->pArray[lVar9];
      iVar6 = (int)*(long *)((long)pVVar7->pArray[lVar9] + 0x10);
      uVar2 = *(undefined4 *)(lVar10 + 0xd8);
      Vec_IntFillExtra((Vec_Int_t *)(lVar10 + 0xe0),iVar6 + 1,(int)in_RDX);
      if (((long)iVar6 < 0) || (*(int *)(lVar10 + 0xe4) <= iVar6)) goto LAB_0088dcf0;
      *(undefined4 *)(*(long *)(lVar10 + 0xe8) + (long)iVar6 * 4) = uVar2;
      lVar9 = lVar9 + 1;
      pVVar7 = pNtk->vCis;
      in_RDX = extraout_RDX_01;
    } while (lVar9 < pVVar7->nSize);
  }
  pVVar7 = pNtk->vObjs;
  iVar6 = 1;
  if (0 < pVVar7->nSize) {
    lVar9 = 0;
    local_3c = 0;
    do {
      plVar3 = (long *)pVVar7->pArray[lVar9];
      if ((plVar3 != (long *)0x0) && ((*(uint *)((long)plVar3 + 0x14) & 0xf) == 7)) {
        iVar6 = *(int *)((long)plVar3 + 0x1c);
        lVar10 = 0;
        iVar8 = 0;
        if (0 < iVar6) {
          do {
            plVar4 = *(long **)(*(long *)(*(long *)(*plVar3 + 0x20) + 8) +
                               (long)*(int *)(plVar3[4] + lVar10 * 4) * 8);
            lVar5 = *plVar4;
            iVar8 = (int)plVar4[2];
            Vec_IntFillExtra((Vec_Int_t *)(lVar5 + 0xe0),iVar8 + 1,(int)in_RDX);
            if (((long)iVar8 < 0) || (*(int *)(lVar5 + 0xe4) <= iVar8)) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                            ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            in_RDX = *plVar4;
            iVar6 = *(int *)((long)plVar3 + 0x1c);
            if (*(int *)(*(long *)(lVar5 + 0xe8) + (long)iVar8 * 4) != *(int *)(in_RDX + 0xd8))
            break;
            lVar10 = lVar10 + 1;
          } while (lVar10 < iVar6);
          iVar8 = (int)lVar10;
        }
        Fill = (int)in_RDX;
        if (iVar8 != iVar6) {
          if (local_3c == 0) {
            printf("Node %d is out of topo order.\n",(ulong)*(uint *)(plVar3 + 2));
            local_3c = 1;
            Fill = extraout_EDX;
          }
          else {
            local_3c = local_3c + 1;
          }
        }
        lVar10 = *plVar3;
        iVar6 = (int)plVar3[2];
        uVar2 = *(undefined4 *)(lVar10 + 0xd8);
        Vec_IntFillExtra((Vec_Int_t *)(lVar10 + 0xe0),iVar6 + 1,Fill);
        if (((long)iVar6 < 0) || (*(int *)(lVar10 + 0xe4) <= iVar6)) {
LAB_0088dcf0:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        *(undefined4 *)(*(long *)(lVar10 + 0xe8) + (long)iVar6 * 4) = uVar2;
        pVVar7 = pNtk->vObjs;
        in_RDX = extraout_RDX_02;
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 < pVVar7->nSize);
    iVar6 = 1;
    if (local_3c != 0) {
      iVar6 = 0;
      printf("Topological order does not hold for %d internal nodes.\n");
    }
  }
  return iVar6;
}

Assistant:

int Abc_NtkIsTopo( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pObj, * pFanin;
    int i, k, Counter = 0;
    Abc_NtkIncrementTravId( pNtk );
    Abc_NtkForEachCi( pNtk, pObj, i )
        Abc_NodeSetTravIdCurrent(pObj);
    Abc_NtkForEachNode( pNtk, pObj, i )
    {
        // check if fanins are in the topo order
        Abc_ObjForEachFanin( pObj, pFanin, k )
            if ( !Abc_NodeIsTravIdCurrent(pFanin) )
                break;
        if ( k != Abc_ObjFaninNum(pObj) )
        {
            if ( Counter++ == 0 )
                printf( "Node %d is out of topo order.\n", Abc_ObjId(pObj) );
        }
        Abc_NodeSetTravIdCurrent(pObj);
    }
    if ( Counter )
        printf( "Topological order does not hold for %d internal nodes.\n", Counter );
    return (int)(Counter == 0);
}